

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_object.cpp
# Opt level: O0

global_object_create_result *
mjs::make_number_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  undefined8 uVar1;
  version vVar2;
  gc_heap *h_00;
  global_object *pgVar3;
  gc_heap_ptr<mjs::gc_string> *name;
  number_object *pnVar4;
  function_object *pfVar5;
  anon_class_8_1_54a39808_for_f f;
  anon_class_16_1_570cf4e1_for_f local_2c0;
  anon_class_16_1_570cf4e1_for_f local_2b0;
  anon_class_16_1_570cf4e1_for_f local_2a0 [2];
  uint32_t local_280;
  undefined4 uStack_27c;
  undefined1 *local_278;
  anon_class_24_3_9804eb10 make_number_function;
  basic_string_view<char,_std::char_traits<char>_> local_238;
  string local_228;
  value local_218;
  basic_string_view<char,_std::char_traits<char>_> local_1f0;
  string local_1e0;
  value local_1d0;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  string local_198;
  value local_188;
  basic_string_view<char,_std::char_traits<char>_> local_160;
  string local_150;
  value local_140;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  string local_108;
  gc_heap_ptr<mjs::object> local_f8;
  value local_e8;
  string local_c0;
  anon_class_16_1_f1e7abc2_for_f local_b0;
  undefined1 local_a0 [24];
  undefined1 local_88 [8];
  gc_heap_ptr<mjs::function_object> c;
  gc_heap_ptr<mjs::object> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40;
  undefined1 local_30 [8];
  gc_heap_ptr<mjs::number_object> prototype;
  gc_heap *h;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  h_00 = gc_heap_ptr_untyped::heap(&global->super_gc_heap_ptr_untyped);
  prototype.super_gc_heap_ptr_untyped._8_8_ = h_00;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"Number");
  string::string(&local_40,h_00,&local_50);
  pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar3->super_object)._vptr_object[0xb])(&local_60);
  c.super_gc_heap_ptr_untyped.pos_ = 0;
  c.super_gc_heap_ptr_untyped._12_4_ = 0;
  gc_heap::make<mjs::number_object,mjs::string,mjs::gc_heap_ptr<mjs::object>,double>
            ((gc_heap *)local_30,(string *)h_00,(gc_heap_ptr<mjs::object> *)&local_40,
             (double *)&local_60);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_60);
  string::~string(&local_40);
  gc_heap_ptr<mjs::number_object>::operator->((gc_heap_ptr<mjs::number_object> *)local_30);
  object::class_name((object *)local_a0);
  name = string::unsafe_raw_get((string *)local_a0);
  make_function<mjs::make_number_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__7>
            ((mjs *)local_88,global,(anon_class_1_0_00000001_for_f *)(local_a0 + 0x17),name,1);
  string::~string((string *)local_a0);
  gc_heap_ptr<mjs::number_object>::gc_heap_ptr
            (&local_b0.prototype,(gc_heap_ptr<mjs::number_object> *)local_30);
  make_constructable<mjs::make_number_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__8>
            (global,(gc_heap_ptr<mjs::function_object> *)local_88,&local_b0);
  make_number_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_8::~__8((__8 *)&local_b0);
  pnVar4 = gc_heap_ptr<mjs::number_object>::operator->((gc_heap_ptr<mjs::number_object> *)local_30);
  pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar3->super_object)._vptr_object[0x13])(&local_c0,pgVar3,"constructor");
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            (&local_f8,(gc_heap_ptr<mjs::function_object> *)local_88);
  value::value(&local_e8,&local_f8);
  (*(pnVar4->super_object)._vptr_object[1])(pnVar4,&local_c0,&local_e8,2);
  value::~value(&local_e8);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_f8);
  string::~string(&local_c0);
  pfVar5 = gc_heap_ptr<mjs::function_object>::operator->
                     ((gc_heap_ptr<mjs::function_object> *)local_88);
  uVar1 = prototype.super_gc_heap_ptr_untyped._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_118,"MAX_VALUE");
  string::string(&local_108,(gc_heap *)uVar1,&local_118);
  value::value(&local_140,1.79769313486232e+308);
  (*(pfVar5->super_native_object).super_object._vptr_object[1])(pfVar5,&local_108,&local_140,7);
  value::~value(&local_140);
  string::~string(&local_108);
  pfVar5 = gc_heap_ptr<mjs::function_object>::operator->
                     ((gc_heap_ptr<mjs::function_object> *)local_88);
  uVar1 = prototype.super_gc_heap_ptr_untyped._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_160,"MIN_VALUE");
  string::string(&local_150,(gc_heap *)uVar1,&local_160);
  value::value(&local_188,4.94065645841247e-324);
  (*(pfVar5->super_native_object).super_object._vptr_object[1])(pfVar5,&local_150,&local_188,7);
  value::~value(&local_188);
  string::~string(&local_150);
  pfVar5 = gc_heap_ptr<mjs::function_object>::operator->
                     ((gc_heap_ptr<mjs::function_object> *)local_88);
  uVar1 = prototype.super_gc_heap_ptr_untyped._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a8,"NaN");
  string::string(&local_198,(gc_heap *)uVar1,&local_1a8);
  value::value(&local_1d0,NAN);
  (*(pfVar5->super_native_object).super_object._vptr_object[1])(pfVar5,&local_198,&local_1d0,7);
  value::~value(&local_1d0);
  string::~string(&local_198);
  pfVar5 = gc_heap_ptr<mjs::function_object>::operator->
                     ((gc_heap_ptr<mjs::function_object> *)local_88);
  uVar1 = prototype.super_gc_heap_ptr_untyped._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1f0,"NEGATIVE_INFINITY");
  string::string(&local_1e0,(gc_heap *)uVar1,&local_1f0);
  value::value(&local_218,-INFINITY);
  (*(pfVar5->super_native_object).super_object._vptr_object[1])(pfVar5,&local_1e0,&local_218,7);
  value::~value(&local_218);
  string::~string(&local_1e0);
  pfVar5 = gc_heap_ptr<mjs::function_object>::operator->
                     ((gc_heap_ptr<mjs::function_object> *)local_88);
  uVar1 = prototype.super_gc_heap_ptr_untyped._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_238,"POSITIVE_INFINITY");
  string::string(&local_228,(gc_heap *)uVar1,&local_238);
  value::value((value *)&make_number_function.h,INFINITY);
  (*(pfVar5->super_native_object).super_object._vptr_object[1])
            (pfVar5,&local_228,&make_number_function.h,7);
  value::~value((value *)&make_number_function.h);
  string::~string(&local_228);
  local_278 = local_30;
  make_number_function.global =
       (gc_heap_ptr<mjs::global_object> *)prototype.super_gc_heap_ptr_untyped._8_8_;
  local_280 = prototype.super_gc_heap_ptr_untyped.pos_;
  uStack_27c = prototype.super_gc_heap_ptr_untyped._12_4_;
  f.h = (gc_heap *)prototype.super_gc_heap_ptr_untyped._8_8_;
  make_number_function.prototype = (gc_heap_ptr<mjs::number_object> *)global;
  make_number_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            ((__0 *)&local_278,"toString",1,
             (anon_class_8_1_54a39808_for_f)prototype.super_gc_heap_ptr_untyped._8_8_);
  make_number_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            ((__0 *)&local_278,"valueOf",0,f);
  pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
  vVar2 = global_object::language_version(pgVar3);
  if (0 < (int)vVar2) {
    local_2a0[1].global.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)prototype.super_gc_heap_ptr_untyped._8_8_;
    make_number_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
              ((__0 *)&local_278,"toLocaleString",0,
               (anon_class_8_1_54a39808_for_f)prototype.super_gc_heap_ptr_untyped._8_8_);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_2a0[0].global,global);
    make_number_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
              ((__0 *)&local_278,"toFixed",1,local_2a0);
    make_number_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_4::~__4((__4 *)local_2a0);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_2b0.global,global);
    make_number_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
              ((__0 *)&local_278,"toExponential",1,&local_2b0);
    make_number_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_5::~__5((__5 *)&local_2b0);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_2c0.global,global);
    make_number_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
              ((__0 *)&local_278,"toPrecision",1,&local_2c0);
    make_number_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_6::~__6((__6 *)&local_2c0);
  }
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            (&__return_storage_ptr__->obj,(gc_heap_ptr<mjs::function_object> *)local_88);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::number_object,void>
            (&__return_storage_ptr__->prototype,(gc_heap_ptr<mjs::number_object> *)local_30);
  gc_heap_ptr<mjs::function_object>::~gc_heap_ptr((gc_heap_ptr<mjs::function_object> *)local_88);
  gc_heap_ptr<mjs::number_object>::~gc_heap_ptr((gc_heap_ptr<mjs::number_object> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

global_object_create_result make_number_object(const gc_heap_ptr<global_object>& global) {
    auto& h = global.heap();
    auto prototype = h.make<number_object>(string{h, "Number"}, global->object_prototype(), 0.);

    auto c = make_function(global, [](const value&, const std::vector<value>& args) {
        return value{args.empty() ? 0.0 : to_number(args.front())};
    }, prototype->class_name().unsafe_raw_get(), 1);
    make_constructable(global, c, [prototype](const value&, const std::vector<value>& args) {
        return value{new_number(prototype, args.empty() ? 0.0 : to_number(args.front()))};
    });

    prototype->put(global->common_string("constructor"), value{c}, global_object::default_attributes);

    c->put(string{h, "MAX_VALUE"}, value{1.7976931348623157e308}, global_object::prototype_attributes);
    c->put(string{h, "MIN_VALUE"}, value{5e-324}, global_object::prototype_attributes);
    c->put(string{h, "NaN"}, value{NAN}, global_object::prototype_attributes);
    c->put(string{h, "NEGATIVE_INFINITY"}, value{-INFINITY}, global_object::prototype_attributes);
    c->put(string{h, "POSITIVE_INFINITY"}, value{INFINITY}, global_object::prototype_attributes);

    auto make_number_function = [&](const char* name, int num_args, auto f) {
        put_native_function(global, prototype, string{h, name}, [prototype, global, f](const value& this_, const std::vector<value>& args){
            if (this_.type() == value_type::number) {
                return value{f(this_.number_value(), args)};
            }
            global->validate_type(this_, prototype, "Number");
            return value{f(static_cast<const number_object&>(*this_.object_value()).number_value(), args)};
        }, num_args);
    };


    make_number_function("toString", 1, [&h](double num, const std::vector<value>& args) {
        const int radix = args.empty() ? 10 : to_int32(args.front());
        if (radix < 2 || radix > 36) {
            std::wostringstream woss;
            woss << "Invalid radix in Number.toString: " << to_string(h, args.front());
            THROW_RUNTIME_ERROR(woss.str());
        }
        if (radix != 10) {
            return string{h, number_to_radix_string(num, radix)};
        }
        return to_string(h, num);
    });
    make_number_function("valueOf", 0, [](double num, const std::vector<value>&) {
        return num;
    });

    if (global->language_version() >= version::es3) {
        make_number_function("toLocaleString", 0, [&h](double num, const std::vector<value>&) {
            return to_string(h, num);
        });
        make_number_function("toFixed", 1, [global](double num, const std::vector<value>& args) {
            const auto f = get_int_arg(args);
            if (f < 0 || f > 20) {
                throw native_error_exception{native_error_type::range, global->stack_trace(), L"fractionDigits out of range in Number.toFixed()"};
            }
            auto& h = global.heap();
            if (std::isnan(num) || std::fabs(num) >= 1e21) {
                return to_string(h, num);
            }
            return string{h, number_to_fixed(num, f)};
        });
        make_number_function("toExponential", 1, [global](double num, const std::vector<value>& args) {
            const auto f = get_int_arg(args);
            if (f < 0 || f > 20) {
                throw native_error_exception{native_error_type::range, global->stack_trace(), L"fractionDigits out of range in Number.toExponential()"};
            }
            auto& h = global.heap();
            if (!std::isfinite(num)) {
                return to_string(h, num);
            }
            return string{h, number_to_exponential(num, f)};
        });
        make_number_function("toPrecision", 1, [global](double num, const std::vector<value>& args) {
            auto& h = global.heap();
            if (args.empty()) {
                return to_string(h, num);
            }
            const auto p = get_int_arg(args);
            if (p < 1 || p > 21) {
                throw native_error_exception{native_error_type::range, global->stack_trace(), L"precision out of range in Number.toPrecision()"};
            }
            if (!std::isfinite(num)) {
                return to_string(h, num);
            }
            return string{h, number_to_precision(num, p)};
        });
    }

    return { c, prototype };
}